

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_err_t split(linear_hash_table_t *linear_hash)

{
  byte *pbVar1;
  char cVar2;
  FILE *pFVar3;
  ion_byte_t *piVar4;
  undefined8 bucket_loc;
  ion_fpos_t iVar5;
  uint uVar6;
  ion_status_t iVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  int key_bytes_as_int;
  uint uVar12;
  int iVar13;
  void *__s;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ion_byte_t *key;
  undefined8 uStack_80;
  undefined8 local_78;
  long local_70;
  undefined1 local_68 [8];
  linear_hash_bucket_t bucket;
  long local_48;
  int local_3c;
  
  local_48 = -1;
  if (linear_hash->next_split < linear_hash->bucket_map->current_size) {
    local_48 = linear_hash->bucket_map->data[linear_hash->next_split];
  }
  uStack_80 = 0x1147fa;
  iVar7.error = linear_hash_get_bucket(local_48,(linear_hash_bucket_t *)local_68,linear_hash);
  iVar7._1_7_ = 0;
  if (iVar7.error == 0) {
    key = (ion_byte_t *)
          ((long)&local_78 -
          ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    bucket.overflow_location =
         (long)key - ((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    sVar10 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = (void *)(bucket.overflow_location - (sVar10 + 0xf & 0xfffffffffffffff0));
    *(undefined8 *)((long)__s + -8) = 0x114860;
    memset(__s,0,sVar10);
    do {
      local_3c = local_68._4_4_;
      if (0 < (int)local_68._4_4_) {
        pFVar3 = (FILE *)linear_hash->database;
        local_70 = local_48 + 0x10;
        *(undefined8 *)((long)__s + -8) = 0x11488c;
        fseek(pFVar3,local_48 + 0x10,0);
        iVar16 = linear_hash->records_per_bucket;
        sVar10 = linear_hash->record_total_size;
        pFVar3 = (FILE *)linear_hash->database;
        *(undefined8 *)((long)__s + -8) = 0x1148a1;
        fread(__s,sVar10,(long)iVar16,pFVar3);
        lVar11 = 0;
        iVar16 = 0;
        do {
          cVar2 = *(char *)((long)__s + lVar11);
          iVar15 = (linear_hash->super).record.key_size;
          sVar10 = (size_t)iVar15;
          local_78 = lVar11;
          *(undefined8 *)((long)__s + -8) = 0x1148d2;
          memcpy(key,(char *)((long)__s + lVar11) + 1,sVar10);
          iVar5 = bucket.overflow_location;
          iVar14 = (linear_hash->super).record.value_size;
          *(undefined8 *)((long)__s + -8) = 0x1148e6;
          memcpy((void *)iVar5,(void *)((long)__s + sVar10 + lVar11 + 1),(long)iVar14);
          if ((long)sVar10 < 2) {
            iVar15 = linear_hash->initial_size;
            uVar6 = 0;
            uVar12 = 0;
          }
          else {
            uVar17 = (ulong)(iVar15 - 1);
            uVar9 = 0;
            uVar6 = 0;
            iVar15 = 3;
            do {
              pbVar1 = key + uVar9;
              lVar11 = uVar9 + 1;
              uVar9 = uVar9 + 1;
              uVar6 = uVar6 + (key_bytes_to_int::coefficients[lVar11] - iVar15) * (uint)*pbVar1;
              iVar15 = key_bytes_to_int::coefficients[lVar11];
            } while (uVar17 != uVar9);
            iVar15 = linear_hash->initial_size;
            uVar9 = 0;
            uVar12 = 0;
            iVar14 = 3;
            do {
              pbVar1 = key + uVar9;
              lVar11 = uVar9 + 1;
              uVar9 = uVar9 + 1;
              uVar12 = uVar12 + (key_bytes_to_int::coefficients[lVar11] - iVar14) * (uint)*pbVar1;
              iVar14 = key_bytes_to_int::coefficients[lVar11];
            } while (uVar17 != uVar9);
            uVar6 = iVar15 - 1U & uVar6;
          }
          if ((cVar2 == '\x01') && (uVar6 != (iVar15 * 2 - 1U & uVar12))) {
            *(undefined8 *)((long)__s + -8) = 0x114980;
            iVar7 = linear_hash_delete(key,linear_hash);
            if (iVar7.error != '\0') goto LAB_001147fe;
            linear_hash->last_cache_idx = 0;
            iVar16 = iVar7.count;
            if (0 < iVar16) {
              iVar15 = 0;
              do {
                iVar5 = bucket.overflow_location;
                iVar14 = linear_hash->last_cache_idx;
                sVar10 = (size_t)(linear_hash->super).record.value_size;
                piVar4 = linear_hash->cache;
                *(undefined8 *)((long)__s + -8) = 0x1149bd;
                memcpy((void *)iVar5,piVar4 + (long)iVar14 * sVar10,sVar10);
                iVar5 = bucket.overflow_location;
                linear_hash->last_cache_idx = iVar14 + 1;
                iVar14 = (linear_hash->super).record.key_size;
                uVar6 = 0;
                if (1 < iVar14) {
                  uVar9 = 0;
                  uVar6 = 0;
                  iVar13 = 3;
                  do {
                    pbVar1 = key + uVar9;
                    lVar11 = uVar9 + 1;
                    uVar9 = uVar9 + 1;
                    uVar6 = uVar6 + (key_bytes_to_int::coefficients[lVar11] - iVar13) *
                                    (uint)*pbVar1;
                    iVar13 = key_bytes_to_int::coefficients[lVar11];
                  } while (iVar14 - 1 != uVar9);
                }
                iVar14 = linear_hash->initial_size;
                *(undefined8 *)((long)__s + -8) = 0x114a19;
                iVar7 = linear_hash_insert(key,(ion_value_t)iVar5,iVar14 * 2 - 1U & uVar6,
                                           linear_hash);
                if (iVar7.error != '\0') goto LAB_001147fe;
                iVar15 = iVar15 + 1;
              } while (iVar15 != iVar16);
            }
            lVar11 = local_70;
            pFVar3 = (FILE *)linear_hash->database;
            iVar16 = 0;
            *(undefined8 *)((long)__s + -8) = 0x114a40;
            fseek(pFVar3,lVar11,0);
            iVar15 = linear_hash->records_per_bucket;
            sVar10 = linear_hash->record_total_size;
            pFVar3 = (FILE *)linear_hash->database;
            *(undefined8 *)((long)__s + -8) = 0x114a55;
            fread(__s,sVar10,(long)iVar15,pFVar3);
            *(undefined8 *)((long)__s + -8) = 0x114a65;
            linear_hash_get_bucket(local_48,(linear_hash_bucket_t *)local_68,linear_hash);
            lVar8 = linear_hash->record_total_size;
            lVar11 = -lVar8;
            local_3c = local_68._4_4_;
          }
          else {
            lVar8 = linear_hash->record_total_size;
            iVar16 = iVar16 + 1;
            lVar11 = local_78;
          }
          lVar11 = lVar11 + lVar8;
        } while (iVar16 < local_3c);
      }
      bucket_loc = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        linear_hash->next_split = linear_hash->next_split + 1;
        iVar7.error = '\0';
        iVar7._1_3_ = 0;
        iVar7.count = 0;
        break;
      }
      local_48._0_4_ = bucket.idx;
      local_48._4_4_ = bucket.record_count;
      *(undefined8 *)((long)__s + -8) = 0x114aab;
      iVar7.error = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_68,linear_hash);
      iVar7._1_7_ = 0;
    } while (iVar7.error == 0);
  }
LAB_001147fe:
  return iVar7.error;
}

Assistant:

ion_err_t
split(
	linear_hash_table_t *linear_hash
) {
	/* status to hold amount of records deleted */
	ion_status_t status					= ION_STATUS_INITIALIZE;

	/* get bucket to split */
	ion_fpos_t				bucket_loc	= bucket_idx_to_ion_fpos_t(linear_hash->next_split, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status.error;
	}

	/* stores for record data */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int split_hash_key;
	int insert_hash_key;

	int			i, j;
	ion_byte_t	*records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false) {
		/* if the bucket is not empty */
		if (bucket.record_count > 0) {
			/* read all records into memory */
			fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
			fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

			/* scan records for records that should be placed in the new bucket */
			for (i = 0; i < bucket.record_count; i++) {
				memcpy(&record_status, records + record_offset, sizeof(record_status));
				memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
				memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

				insert_hash_key = insert_hash_to_bucket(record_key, linear_hash);

				split_hash_key	= hash_to_bucket(record_key, linear_hash);

				/* if the record is not a tombstone and h0(k) != h1(k) */
				if ((record_status == linear_hash_record_status_full) && (insert_hash_key != split_hash_key)) {
					/* delete all records with this key from the table */
					status = linear_hash_delete(record_key, linear_hash);

					if (status.error != err_ok) {
						return status.error;
					}

					int num_deleted = status.count;

					linear_hash->last_cache_idx = 0;

					/* insert that many records into the table */
					for (j = 0; j < num_deleted; j++) {
						memcpy(record_value, linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						status = linear_hash_insert(record_key, record_value, hash_to_bucket(record_key, linear_hash), linear_hash);

						if (status.error != err_ok) {
							return status.error;
						}
					}

					/* refresh cached data and restart iteration and offset tracker */
					fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
					fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);
					status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
					i				= -1;
					record_offset	= -1 * linear_hash->record_total_size;
				}

				/* track offset from locations of records in memory the next record is at */
				record_offset += linear_hash->record_total_size;
			}

			/* reset offset */
			record_offset = 0;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status.error;
			}
		}
	}

	return linear_hash_increment_next_split(linear_hash);
}